

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(Array2D<Imath_3_2::half> *this,long sizeX,long sizeY)

{
  half *phVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < sizeY * sizeX) {
    uVar2 = sizeY * sizeX * 2;
  }
  phVar1 = (half *)operator_new__(uVar2);
  if (this->_data != (half *)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = phVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}